

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int64_t wallet::ParseISO8601DateTime(string *str)

{
  bool bVar1;
  int iVar2;
  locale *__other;
  time_input_facet<boost::posix_time::ptime,_char,_std::istreambuf_iterator<char,_std::char_traits<char>_>_>
  *__f;
  string *in_RDI;
  long in_FS_OFFSET;
  ptime ptime;
  istringstream iss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  ptime *in_stack_fffffffffffffdd0;
  ptime *in_stack_fffffffffffffdd8;
  undefined6 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  ptime in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe1c;
  sec_type local_1d0;
  ptime *in_stack_fffffffffffffe40;
  locale in_stack_fffffffffffffe48;
  allocator<char> local_1a9;
  istringstream local_1a8 [416];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (ParseISO8601DateTime(std::__cxx11::string_const&)::epoch == '\0') {
    iVar2 = __cxa_guard_acquire(&ParseISO8601DateTime(std::__cxx11::string_const&)::epoch);
    if (iVar2 != 0) {
      ParseISO8601DateTime::epoch =
           boost::posix_time::from_time_t
                     (CONCAT17(in_stack_fffffffffffffdef,
                               CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
      in_stack_fffffffffffffe08 = ParseISO8601DateTime::epoch;
      __cxa_guard_release(&ParseISO8601DateTime(std::__cxx11::string_const&)::epoch);
    }
  }
  if (ParseISO8601DateTime(std::__cxx11::string_const&)::loc == '\0') {
    iVar2 = __cxa_guard_acquire(&ParseISO8601DateTime(std::__cxx11::string_const&)::loc);
    if (iVar2 != 0) {
      __other = (locale *)std::locale::classic();
      __f = (time_input_facet<boost::posix_time::ptime,_char,_std::istreambuf_iterator<char,_std::char_traits<char>_>_>
             *)operator_new(0x240);
      uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffe18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe1c,uVar3),
                 (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (allocator<char> *)
                 in_stack_fffffffffffffe08.
                 super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                 .time_.time_count_.value_);
      boost::date_time::
      time_input_facet<boost::posix_time::ptime,_char,_std::istreambuf_iterator<char,_std::char_traits<char>_>_>
      ::time_input_facet((time_input_facet<boost::posix_time::ptime,_char,_std::istreambuf_iterator<char,_std::char_traits<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         (string_type *)
                         in_stack_fffffffffffffe08.
                         super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                         .time_.time_count_.value_,(size_t)__other);
      std::locale::
      locale<boost::date_time::time_input_facet<boost::posix_time::ptime,char,std::istreambuf_iterator<char,std::char_traits<char>>>>
                ((locale *)
                 in_stack_fffffffffffffe08.
                 super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                 .time_.time_count_.value_,__other,__f);
      std::__cxx11::string::~string(in_stack_fffffffffffffdc8);
      std::allocator<char>::~allocator(&local_1a9);
      __cxa_atexit(std::locale::~locale,&ParseISO8601DateTime::loc,&__dso_handle);
      __cxa_guard_release(&ParseISO8601DateTime(std::__cxx11::string_const&)::loc);
    }
  }
  std::__cxx11::istringstream::istringstream(local_1a8,in_RDI,_S_in);
  std::ios::imbue((locale *)&stack0xfffffffffffffe48);
  std::locale::~locale((locale *)&stack0xfffffffffffffe48);
  boost::posix_time::ptime::ptime((ptime *)in_stack_fffffffffffffdc8,not_a_date_time);
  boost::posix_time::operator>>
            ((basic_istream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48._M_impl,
             in_stack_fffffffffffffe40);
  bVar1 = boost::date_time::
          base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
          ::is_not_a_date_time
                    ((base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                      *)in_stack_fffffffffffffdc8);
  if (!bVar1) {
    bVar1 = boost::operators_impl::operator>(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    if (!bVar1) {
      boost::date_time::
      base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
      ::operator-(&in_stack_fffffffffffffdd0->
                   super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                  ,(time_type *)in_stack_fffffffffffffdc8);
      local_1d0 = boost::date_time::
                  time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                  ::total_seconds((time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                   *)in_stack_fffffffffffffdd8);
      goto LAB_005e10b5;
    }
  }
  local_1d0 = 0;
LAB_005e10b5:
  std::__cxx11::istringstream::~istringstream(local_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1d0;
  }
  __stack_chk_fail();
}

Assistant:

int64_t ParseISO8601DateTime(const std::string& str)
{
    static const boost::posix_time::ptime epoch = boost::posix_time::from_time_t(0);
    static const std::locale loc(std::locale::classic(),
        new boost::posix_time::time_input_facet("%Y-%m-%dT%H:%M:%SZ"));
    std::istringstream iss(str);
    iss.imbue(loc);
    boost::posix_time::ptime ptime(boost::date_time::not_a_date_time);
    iss >> ptime;
    if (ptime.is_not_a_date_time() || epoch > ptime)
        return 0;
    return (ptime - epoch).total_seconds();
}